

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O2

cl_uint __thiscall CLIntercept::getRefCount(CLIntercept *this,cl_accelerator_intel accelerator)

{
  cl_platform_id platform;
  CLdispatchX *pCVar1;
  allocator local_41;
  cl_uint refCount;
  
  platform = getPlatform(this,accelerator);
  pCVar1 = dispatchX(this,platform);
  if (pCVar1->clGetAcceleratorInfoINTEL ==
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    std::__cxx11::string::string((string *)&refCount,"clGetAcceleratorInfoINTEL",&local_41);
    getExtensionFunctionAddress(this,platform,(string *)&refCount);
    std::__cxx11::string::~string((string *)&refCount);
  }
  refCount = 0;
  pCVar1 = dispatchX(this,platform);
  if (pCVar1->clGetAcceleratorInfoINTEL ==
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    refCount = 0;
  }
  else {
    (*pCVar1->clGetAcceleratorInfoINTEL)(accelerator,0x4091,4,&refCount,(size_t *)0x0);
  }
  return refCount;
}

Assistant:

inline cl_uint CLIntercept::getRefCount( cl_accelerator_intel accelerator )
{
    cl_platform_id  platform = this->getPlatform(accelerator);
    if( dispatchX(platform).clGetAcceleratorInfoINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clGetAcceleratorInfoINTEL" );
    }

    cl_uint refCount = 0;
    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clGetAcceleratorInfoINTEL )
    {
        dispatchX.clGetAcceleratorInfoINTEL(
            accelerator,
            CL_ACCELERATOR_REFERENCE_COUNT_INTEL,
            sizeof(refCount),
            &refCount,
            NULL );
    }
    return refCount;
}